

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O1

int llex(LexState *ls,SemInfo *seminfo)

{
  size_t *psVar1;
  size_t sVar2;
  byte bVar3;
  ZIO *pZVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  TString *pTVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  unsigned_long x;
  long lVar15;
  bool bVar16;
  char local_38 [8];
  
  ls->buff->n = 0;
LAB_00128862:
  uVar6 = ls->current;
  switch(uVar6) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x21:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x3b:
    goto switchD_00128879_caseD_0;
  case 9:
  case 0xb:
  case 0xc:
  case 0x20:
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar6 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar6 = (uint)*pbVar5;
    }
    ls->current = uVar6;
    goto LAB_00128862;
  case 10:
  case 0xd:
    inclinenumber(ls);
    goto LAB_00128862;
  case 0x22:
  case 0x27:
    save(ls,uVar6);
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar7 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar7 = (uint)*pbVar5;
    }
    ls->current = uVar7;
    goto joined_r0x00128a66;
  case 0x2d:
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar6 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar6 = (uint)*pbVar5;
    }
    ls->current = uVar6;
    if (uVar6 != 0x2d) {
      return 0x2d;
    }
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar6 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar6 = (uint)*pbVar5;
    }
    ls->current = uVar6;
    if (uVar6 == 0x5b) {
      iVar10 = skip_sep(ls);
      ls->buff->n = 0;
      if (iVar10 < 0) goto LAB_00128952;
      read_long_string(ls,(SemInfo *)0x0,iVar10);
      ls->buff->n = 0;
    }
    else {
LAB_00128952:
      while ((uVar6 = ls->current + 1, 0xe < uVar6 || ((0x4801U >> (uVar6 & 0x1f) & 1) == 0))) {
        pZVar4 = ls->z;
        sVar2 = pZVar4->n;
        pZVar4->n = pZVar4->n - 1;
        if (sVar2 == 0) {
          uVar6 = luaZ_fill(pZVar4);
        }
        else {
          pbVar5 = (byte *)pZVar4->p;
          pZVar4->p = (char *)(pbVar5 + 1);
          uVar6 = (uint)*pbVar5;
        }
        ls->current = uVar6;
      }
    }
    goto LAB_00128862;
  case 0x2e:
    save(ls,0x2e);
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar6 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar6 = (uint)*pbVar5;
    }
    ls->current = uVar6;
    iVar10 = check_next1(ls,0x2e);
    if (iVar10 != 0) {
      iVar10 = check_next1(ls,0x2e);
      return 0x119 - (uint)(iVar10 == 0);
    }
    if ((""[(long)ls->current + 1] & 2) == 0) {
      return 0x2e;
    }
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    iVar10 = read_numeral(ls,seminfo);
    return iVar10;
  case 0x2f:
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar6 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar6 = (uint)*pbVar5;
    }
    ls->current = uVar6;
    iVar9 = 0x2f;
    iVar10 = check_next1(ls,0x2f);
    bVar16 = iVar10 == 0;
    iVar10 = 0x117;
    break;
  case 0x3a:
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar6 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar6 = (uint)*pbVar5;
    }
    ls->current = uVar6;
    iVar9 = 0x3a;
    iVar10 = check_next1(ls,0x3a);
    bVar16 = iVar10 == 0;
    iVar10 = 0x120;
    break;
  case 0x3c:
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar6 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar6 = (uint)*pbVar5;
    }
    ls->current = uVar6;
    iVar10 = check_next1(ls,0x3d);
    if (iVar10 != 0) {
      return 0x11c;
    }
    iVar9 = 0x3c;
    iVar10 = check_next1(ls,0x3c);
    bVar16 = iVar10 == 0;
    iVar10 = 0x11e;
    break;
  case 0x3d:
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar6 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar6 = (uint)*pbVar5;
    }
    ls->current = uVar6;
    iVar9 = 0x3d;
    iVar10 = check_next1(ls,0x3d);
    bVar16 = iVar10 == 0;
    iVar10 = 0x11a;
    break;
  case 0x3e:
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar6 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar6 = (uint)*pbVar5;
    }
    ls->current = uVar6;
    iVar10 = check_next1(ls,0x3d);
    if (iVar10 != 0) {
      return 0x11b;
    }
    iVar9 = 0x3e;
    iVar10 = check_next1(ls,0x3e);
    bVar16 = iVar10 == 0;
    iVar10 = 0x11f;
    break;
  case 0xffffffff:
    return 0x121;
  default:
    if (uVar6 != 0x5b) {
      if (uVar6 == 0x7e) {
        pZVar4 = ls->z;
        sVar2 = pZVar4->n;
        pZVar4->n = pZVar4->n - 1;
        if (sVar2 == 0) {
          uVar6 = luaZ_fill(pZVar4);
        }
        else {
          pbVar5 = (byte *)pZVar4->p;
          pZVar4->p = (char *)(pbVar5 + 1);
          uVar6 = (uint)*pbVar5;
        }
        ls->current = uVar6;
        iVar10 = check_next1(ls,0x3d);
        if (iVar10 != 0) {
          return 0x11d;
        }
        return 0x7e;
      }
switchD_00128879_caseD_0:
      if ((""[(long)(int)uVar6 + 1] & 1) == 0) {
        pZVar4 = ls->z;
        sVar2 = pZVar4->n;
        pZVar4->n = pZVar4->n - 1;
        if (sVar2 == 0) {
          uVar7 = luaZ_fill(pZVar4);
        }
        else {
          pbVar5 = (byte *)pZVar4->p;
          pZVar4->p = (char *)(pbVar5 + 1);
          uVar7 = (uint)*pbVar5;
        }
        ls->current = uVar7;
        return uVar6;
      }
      do {
        save(ls,ls->current);
        pZVar4 = ls->z;
        sVar2 = pZVar4->n;
        pZVar4->n = pZVar4->n - 1;
        if (sVar2 == 0) {
          uVar6 = luaZ_fill(pZVar4);
        }
        else {
          pbVar5 = (byte *)pZVar4->p;
          pZVar4->p = (char *)(pbVar5 + 1);
          uVar6 = (uint)*pbVar5;
        }
        ls->current = uVar6;
      } while ((""[(long)(int)uVar6 + 1] & 3) != 0);
      pTVar11 = luaX_newstring(ls,ls->buff->buffer,ls->buff->n);
      seminfo->ts = pTVar11;
      if (pTVar11->tt != '\x04') {
        return 0x124;
      }
      if (pTVar11->extra == 0) {
        return 0x124;
      }
      return pTVar11->extra | 0x100;
    }
    iVar10 = skip_sep(ls);
    if (-1 < iVar10) {
      read_long_string(ls,seminfo,iVar10);
      return 0x125;
    }
    if (iVar10 == -1) {
      return 0x5b;
    }
    pcVar13 = "invalid long string delimiter";
    goto LAB_001291c4;
  }
  if (!bVar16) {
    return iVar10;
  }
  return iVar9;
joined_r0x00128a66:
  if (uVar7 == uVar6) {
    save(ls,uVar7);
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar6 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar6 = (uint)*pbVar5;
    }
    ls->current = uVar6;
    pTVar11 = luaX_newstring(ls,ls->buff->buffer + 1,ls->buff->n - 2);
    seminfo->ts = pTVar11;
    return 0x125;
  }
  if ((int)uVar7 < 0x5c) {
    if (uVar7 == 0xffffffff) {
      lexerror(ls,"unfinished string",0x121);
    }
    if ((uVar7 == 10) || (uVar7 == 0xd)) {
      pcVar13 = "unfinished string";
LAB_001291c4:
      lexerror(ls,pcVar13,0x125);
    }
LAB_00128ad9:
    save(ls,uVar7);
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar7 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar7 = (uint)*pbVar5;
    }
    ls->current = uVar7;
    goto LAB_00128d16;
  }
  if (uVar7 != 0x5c) goto LAB_00128ad9;
  save(ls,0x5c);
  pZVar4 = ls->z;
  sVar2 = pZVar4->n;
  pZVar4->n = pZVar4->n - 1;
  if (sVar2 == 0) {
    uVar7 = luaZ_fill(pZVar4);
  }
  else {
    pbVar5 = (byte *)pZVar4->p;
    pZVar4->p = (char *)(pbVar5 + 1);
    uVar7 = (uint)*pbVar5;
  }
  ls->current = uVar7;
  if ((int)uVar7 < 0x62) {
    if (0x21 < (int)uVar7) {
      uVar14 = uVar7;
      if ((int)uVar7 < 0x5c) {
        if ((uVar7 != 0x22) && (uVar7 != 0x27)) goto switchD_00128b43_caseD_6f;
      }
      else if ((uVar7 != 0x5c) && (uVar14 = 7, uVar7 != 0x61)) goto switchD_00128b43_caseD_6f;
      goto LAB_00128ce1;
    }
    if (uVar7 == 0xffffffff) goto LAB_00128d16;
    if ((uVar7 != 10) && (uVar7 != 0xd)) goto switchD_00128b43_caseD_6f;
    inclinenumber(ls);
    uVar14 = 10;
    goto LAB_00128d03;
  }
  switch(uVar7) {
  case 0x6e:
    uVar14 = 10;
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x77:
  case 0x79:
switchD_00128b43_caseD_6f:
    esccheck(ls,""[(long)(int)uVar7 + 1] & 2,"invalid escape sequence");
    uVar14 = 0;
    uVar7 = 0;
    do {
      iVar10 = ls->current;
      if ((""[(long)iVar10 + 1] & 2) == 0) goto LAB_00128c1c;
      save(ls,iVar10);
      pZVar4 = ls->z;
      sVar2 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar2 == 0) {
        uVar8 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar8 = (uint)*pbVar5;
      }
      uVar14 = iVar10 + -0x30 + uVar14 * 10;
      ls->current = uVar8;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 3);
    uVar7 = 3;
LAB_00128c1c:
    esccheck(ls,(uint)((int)uVar14 < 0x100),"decimal escape too large");
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - (ulong)uVar7;
    goto LAB_00128d03;
  case 0x72:
    uVar14 = 0xd;
    break;
  case 0x74:
    uVar14 = 9;
    break;
  case 0x75:
    save(ls,uVar7);
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar7 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar7 = (uint)*pbVar5;
    }
    ls->current = uVar7;
    esccheck(ls,(uint)(uVar7 == 0x7b),"missing \'{\'");
    iVar10 = gethexa(ls);
    x = (unsigned_long)iVar10;
    lVar15 = -4;
    while( true ) {
      save(ls,ls->current);
      pZVar4 = ls->z;
      sVar2 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar2 == 0) {
        uVar7 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar7 = (uint)*pbVar5;
      }
      ls->current = uVar7;
      if ((""[(long)(int)uVar7 + 1] & 0x10) == 0) break;
      iVar10 = luaO_hexavalue(uVar7);
      x = x * 0x10 + (long)iVar10;
      esccheck(ls,(uint)(x < 0x110000),"UTF-8 value too large");
      lVar15 = lVar15 + -1;
    }
    esccheck(ls,(uint)(uVar7 == 0x7d),"missing \'}\'");
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar7 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar7 = (uint)*pbVar5;
    }
    ls->current = uVar7;
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 + lVar15;
    uVar7 = luaO_utf8esc(local_38,x);
    if (0 < (int)uVar7) {
      pcVar13 = &stack0xffffffffffffffd0 + -(ulong)uVar7;
      lVar15 = (ulong)uVar7 + 1;
      do {
        save(ls,(int)*pcVar13);
        lVar15 = lVar15 + -1;
        pcVar13 = pcVar13 + 1;
      } while (1 < lVar15);
    }
    goto LAB_00128d16;
  case 0x76:
    uVar14 = 0xb;
    break;
  case 0x78:
    iVar10 = gethexa(ls);
    iVar9 = gethexa(ls);
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - 2;
    uVar14 = iVar9 + iVar10 * 0x10;
    break;
  case 0x7a:
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - 1;
    pZVar4 = ls->z;
    sVar2 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar2 == 0) {
      uVar7 = luaZ_fill(pZVar4);
      uVar12 = (ulong)uVar7;
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar12 = (ulong)*pbVar5;
    }
    ls->current = (int)uVar12;
    bVar3 = ""[(long)(int)uVar12 + 1];
    while ((bVar3 & 8) != 0) {
      if (((int)uVar12 == 0xd) || ((int)uVar12 == 10)) {
        inclinenumber(ls);
      }
      else {
        pZVar4 = ls->z;
        sVar2 = pZVar4->n;
        pZVar4->n = pZVar4->n - 1;
        if (sVar2 == 0) {
          uVar7 = luaZ_fill(pZVar4);
        }
        else {
          pbVar5 = (byte *)pZVar4->p;
          pZVar4->p = (char *)(pbVar5 + 1);
          uVar7 = (uint)*pbVar5;
        }
        ls->current = uVar7;
      }
      uVar12 = (ulong)ls->current;
      bVar3 = ""[uVar12 + 1];
    }
    goto LAB_00128d16;
  default:
    if (uVar7 == 0x66) {
      uVar14 = 0xc;
    }
    else {
      if (uVar7 != 0x62) goto switchD_00128b43_caseD_6f;
      uVar14 = 8;
    }
  }
LAB_00128ce1:
  pZVar4 = ls->z;
  sVar2 = pZVar4->n;
  pZVar4->n = pZVar4->n - 1;
  if (sVar2 == 0) {
    uVar7 = luaZ_fill(pZVar4);
  }
  else {
    pbVar5 = (byte *)pZVar4->p;
    pZVar4->p = (char *)(pbVar5 + 1);
    uVar7 = (uint)*pbVar5;
  }
  ls->current = uVar7;
LAB_00128d03:
  psVar1 = &ls->buff->n;
  *psVar1 = *psVar1 - 1;
  save(ls,uVar14);
LAB_00128d16:
  uVar7 = ls->current;
  goto joined_r0x00128a66;
}

Assistant:

static int llex (LexState *ls, SemInfo *seminfo) {
  luaZ_resetbuffer(ls->buff);
  for (;;) {
    switch (ls->current) {
      case '\n': case '\r': {  /* line breaks */
        inclinenumber(ls);
        break;
      }
      case ' ': case '\f': case '\t': case '\v': {  /* spaces */
        next(ls);
        break;
      }
      case '-': {  /* '-' or '--' (comment) */
        next(ls);
        if (ls->current != '-') return '-';
        /* else is a comment */
        next(ls);
        if (ls->current == '[') {  /* long comment? */
          int sep = skip_sep(ls);
          luaZ_resetbuffer(ls->buff);  /* 'skip_sep' may dirty the buffer */
          if (sep >= 0) {
            read_long_string(ls, NULL, sep);  /* skip long comment */
            luaZ_resetbuffer(ls->buff);  /* previous call may dirty the buff. */
            break;
          }
        }
        /* else short comment */
        while (!currIsNewline(ls) && ls->current != EOZ)
          next(ls);  /* skip until end of line (or end of file) */
        break;
      }
      case '[': {  /* long string or simply '[' */
        int sep = skip_sep(ls);
        if (sep >= 0) {
          read_long_string(ls, seminfo, sep);
          return TK_STRING;
        }
        else if (sep != -1)  /* '[=...' missing second bracket */
          lexerror(ls, "invalid long string delimiter", TK_STRING);
        return '[';
      }
      case '=': {
        next(ls);
        if (check_next1(ls, '=')) return TK_EQ;
        else return '=';
      }
      case '<': {
        next(ls);
        if (check_next1(ls, '=')) return TK_LE;
        else if (check_next1(ls, '<')) return TK_SHL;
        else return '<';
      }
      case '>': {
        next(ls);
        if (check_next1(ls, '=')) return TK_GE;
        else if (check_next1(ls, '>')) return TK_SHR;
        else return '>';
      }
      case '/': {
        next(ls);
        if (check_next1(ls, '/')) return TK_IDIV;
        else return '/';
      }
      case '~': {
        next(ls);
        if (check_next1(ls, '=')) return TK_NE;
        else return '~';
      }
      case ':': {
        next(ls);
        if (check_next1(ls, ':')) return TK_DBCOLON;
        else return ':';
      }
      case '"': case '\'': {  /* short literal strings */
        read_string(ls, ls->current, seminfo);
        return TK_STRING;
      }
      case '.': {  /* '.', '..', '...', or number */
        save_and_next(ls);
        if (check_next1(ls, '.')) {
          if (check_next1(ls, '.'))
            return TK_DOTS;   /* '...' */
          else return TK_CONCAT;   /* '..' */
        }
        else if (!lisdigit(ls->current)) return '.';
        else return read_numeral(ls, seminfo);
      }
      case '0': case '1': case '2': case '3': case '4':
      case '5': case '6': case '7': case '8': case '9': {
        return read_numeral(ls, seminfo);
      }
      case EOZ: {
        return TK_EOS;
      }
      default: {
        if (lislalpha(ls->current)) {  /* identifier or reserved word? */
          TString *ts;
          do {
            save_and_next(ls);
          } while (lislalnum(ls->current));
          ts = luaX_newstring(ls, luaZ_buffer(ls->buff),
                                  luaZ_bufflen(ls->buff));
          seminfo->ts = ts;
          if (isreserved(ts))  /* reserved word? */
            return ts->extra - 1 + FIRST_RESERVED;
          else {
            return TK_NAME;
          }
        }
        else {  /* single-char tokens (+ - / ...) */
          int c = ls->current;
          next(ls);
          return c;
        }
      }
    }
  }
}